

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_signal.cpp
# Opt level: O2

int __thiscall
CsSignal::SignalBase::internal_cntConnections
          (SignalBase *this,SlotBase *receiver,BentoAbstract *signalMethod_Bento)

{
  byte bVar1;
  rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
  *prVar2;
  int iVar3;
  undefined8 *puVar4;
  read_handle senderListHandle;
  read_handle local_40;
  
  local_40.m_ptr = &(this->m_connectList).m_obj;
  local_40.m_accessed = false;
  prVar2 = libguarded::
           rcu_guarded<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>_>
           ::read_handle::operator*(&local_40);
  iVar3 = 0;
  for (puVar4 = *(undefined8 **)prVar2; puVar4 != (undefined8 *)0x0; puVar4 = (undefined8 *)*puVar4)
  {
    if ((receiver == (SlotBase *)0x0) || ((SlotBase *)puVar4[4] == receiver)) {
      bVar1 = (**(code **)(*(long *)puVar4[3] + 0x10))((long *)puVar4[3],signalMethod_Bento);
      iVar3 = iVar3 + (uint)bVar1;
    }
  }
  libguarded::
  rcu_guarded<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>_>
  ::read_handle::~read_handle(&local_40);
  return iVar3;
}

Assistant:

int CsSignal::SignalBase::internal_cntConnections(const SlotBase *receiver,
                  const Internal::BentoAbstract &signalMethod_Bento) const
{
   int retval = 0;

   auto senderListHandle = m_connectList.lock_read();

   for (auto &item : *senderListHandle) {

      if (receiver && item.receiver != receiver) {
         continue;
      }

      if (*(item.signalMethod) != signalMethod_Bento)  {
         continue;
      }

      retval++;
   }

   return retval;
}